

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::CZString::operator==(CZString *this,CZString *other)

{
  int iVar1;
  int comp;
  allocator local_49;
  string local_48;
  uint local_28;
  uint local_24;
  uint other_len;
  uint this_len;
  CZString *other_local;
  CZString *this_local;
  
  if (this->cstr_ == (char *)0x0) {
    this_local._7_1_ = (this->field_1).index_ == (other->field_1).index_;
  }
  else {
    local_24 = (this->field_1).index_ >> 2;
    local_28 = (other->field_1).index_ >> 2;
    if (local_24 == local_28) {
      _other_len = other;
      other_local = this;
      if ((this->cstr_ == (char *)0x0) || (other->cstr_ == (char *)0x0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_48,"assert json failed",&local_49);
        throwLogicError(&local_48);
      }
      iVar1 = memcmp(this->cstr_,other->cstr_,(ulong)local_24);
      this_local._7_1_ = iVar1 == 0;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Value::CZString::operator==(const CZString& other) const {
  if (!cstr_) return index_ == other.index_;
  //return strcmp(cstr_, other.cstr_) == 0;
  // Assume both are strings.
  unsigned this_len = this->storage_.length_;
  unsigned other_len = other.storage_.length_;
  if (this_len != other_len) return false;
  JSON_ASSERT(this->cstr_ && other.cstr_);
  int comp = memcmp(this->cstr_, other.cstr_, this_len);
  return comp == 0;
}